

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall inja::FileError::FileError(FileError *this,string *message)

{
  allocator<char> local_39;
  string local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"file_error",&local_39);
  InjaError::InjaError(&this->super_InjaError,&local_38,message);
  ::std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_InjaError = &PTR__InjaError_0019c220;
  return;
}

Assistant:

explicit FileError(const std::string& message): InjaError("file_error", message) {}